

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_compare_firstGreaterThanSecond_fn(int _i)

{
  AString string;
  AString string_00;
  AString string_01;
  AString string_02;
  int iVar1;
  char *in_stack_fffffffffffffbd0;
  uintmax_t _ck_y_31;
  uintmax_t _ck_x_39;
  uintmax_t _ck_y_30;
  uintmax_t _ck_x_38;
  char *_ck_y_q_7;
  char *_ck_x_q_7;
  char *_ck_y_s_7;
  char *_ck_x_s_7;
  char *_ck_y_29;
  char *_ck_x_37;
  void *_ck_x_36;
  uintmax_t _ck_y_28;
  uintmax_t _ck_x_35;
  uintmax_t _ck_y_27;
  uintmax_t _ck_x_34;
  char *_ck_y_q_6;
  char *_ck_x_q_6;
  char *_ck_y_s_6;
  char *_ck_x_s_6;
  char *_ck_y_26;
  char *_ck_x_33;
  void *_ck_x_32;
  uintmax_t _ck_y_25;
  uintmax_t _ck_x_31;
  intmax_t _ck_y_24;
  intmax_t _ck_x_30;
  uintmax_t _ck_y_23;
  uintmax_t _ck_x_29;
  uintmax_t _ck_y_22;
  uintmax_t _ck_x_28;
  char *_ck_y_q_5;
  char *_ck_x_q_5;
  char *_ck_y_s_5;
  char *_ck_x_s_5;
  char *_ck_y_21;
  char *_ck_x_27;
  void *_ck_x_26;
  uintmax_t _ck_y_20;
  uintmax_t _ck_x_25;
  uintmax_t _ck_y_19;
  uintmax_t _ck_x_24;
  char *_ck_y_q_4;
  char *_ck_x_q_4;
  char *_ck_y_s_4;
  char *_ck_x_s_4;
  char *_ck_y_18;
  char *_ck_x_23;
  void *_ck_x_22;
  uintmax_t _ck_y_17;
  uintmax_t _ck_x_21;
  intmax_t _ck_y_16;
  intmax_t _ck_x_20;
  uintmax_t _ck_y_15;
  uintmax_t _ck_x_19;
  uintmax_t _ck_y_14;
  uintmax_t _ck_x_18;
  char *_ck_y_q_3;
  char *_ck_x_q_3;
  char *_ck_y_s_3;
  char *_ck_x_s_3;
  char *_ck_y_13;
  char *_ck_x_17;
  void *_ck_x_16;
  uintmax_t _ck_y_12;
  uintmax_t _ck_x_15;
  uintmax_t _ck_y_11;
  uintmax_t _ck_x_14;
  char *_ck_y_q_2;
  char *_ck_x_q_2;
  char *_ck_y_s_2;
  char *_ck_x_s_2;
  char *_ck_y_10;
  char *_ck_x_13;
  void *_ck_x_12;
  uintmax_t _ck_y_9;
  uintmax_t _ck_x_11;
  intmax_t _ck_y_8;
  intmax_t _ck_x_10;
  uintmax_t _ck_y_7;
  uintmax_t _ck_x_9;
  uintmax_t _ck_y_6;
  uintmax_t _ck_x_8;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_5;
  char *_ck_x_7;
  void *_ck_x_6;
  uintmax_t _ck_y_4;
  uintmax_t _ck_x_5;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_4;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_2;
  char *_ck_x_3;
  void *_ck_x_2;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  intmax_t _ck_y;
  intmax_t _ck_x;
  AString string4;
  AString string3;
  AString string2;
  AString string1;
  int _i_local;
  
  private_ACUtilsTest_AString_constructTestString((AString *)&string2.buffer,"",8);
  private_ACUtilsTest_AString_constructTestString((AString *)&string3.buffer,"a",8);
  private_ACUtilsTest_AString_constructTestString((AString *)&string4.buffer,"b",8);
  private_ACUtilsTest_AString_constructTestString((AString *)&_ck_x,"ba",8);
  private_ACUtilsTest_AString_setReallocFail(false,0);
  iVar1 = AString_compare((AString *)&string3.buffer,(AString *)&string2.buffer);
  if ((long)iVar1 < 1) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8ef,"Assertion \'_ck_x > _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %jd, %s == %jd",
                      "AString_compare(&string2, &string1) > 0",
                      "AString_compare(&string2, &string1)",(long)iVar1,"0",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8ef);
  if (string1.size != 8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f0,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string1).capacity == (8)",
                      "(string1).capacity",string1.size,"(8)",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8f0);
  if (string1.capacity == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f0,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (string1).buffer != NULL",
                      "(void*) (string1).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8f0);
  if (string1.capacity == 0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar1 = strcmp("",(char *)string1.capacity);
    _ck_y_s = (char *)string1.capacity;
    if (iVar1 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8f0);
      if (string1.deallocator != (ACUtilsDeallocator)0x0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8f0,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string1).size == strlen(\"\")","(string1).size",string1.deallocator,
                          "strlen(\"\")",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8f0);
      if (string2.size != 8) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8f1,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string2).capacity == (8)","(string2).capacity",string2.size,"(8)",8,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8f1);
      if (string2.capacity == 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8f1,"Assertion \'_ck_x != NULL\' failed",
                          "Assertion \'%s\' failed: %s == %#x","(void*) (string2).buffer != NULL",
                          "(void*) (string2).buffer",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8f1);
      _ck_y_s_1 = (char *)string2.capacity;
      if (string2.capacity == 0) {
        _ck_y_q_1 = "";
        _ck_y_s_1 = "(null)";
      }
      else {
        _ck_y_q_1 = "\"";
        iVar1 = strcmp("a",(char *)string2.capacity);
        if (iVar1 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f1);
          if (string2.deallocator != (ACUtilsDeallocator)0x1) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8f1,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "(string2).size == strlen(\"a\")","(string2).size",string2.deallocator
                              ,"strlen(\"a\")",1,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f1);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8f2,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "private_ACUtilsTest_AString_reallocCount == (0)",
                              "private_ACUtilsTest_AString_reallocCount",
                              private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f2);
          iVar1 = AString_compare((AString *)&string4.buffer,(AString *)&string3.buffer);
          if ((long)iVar1 < 1) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8f3,"Assertion \'_ck_x > _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %jd, %s == %jd",
                              "AString_compare(&string3, &string2) > 0",
                              "AString_compare(&string3, &string2)",(long)iVar1,"0",0,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f3);
          if (string2.size != 8) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8f4,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "(string2).capacity == (8)","(string2).capacity",string2.size,"(8)",8,
                              0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f4);
          if (string2.capacity == 0) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8f4,"Assertion \'_ck_x != NULL\' failed",
                              "Assertion \'%s\' failed: %s == %#x",
                              "(void*) (string2).buffer != NULL","(void*) (string2).buffer",0,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8f4);
          _ck_y_s_2 = (char *)string2.capacity;
          if (string2.capacity == 0) {
            _ck_y_q_2 = "";
            _ck_y_s_2 = "(null)";
          }
          else {
            _ck_y_q_2 = "\"";
            iVar1 = strcmp("a",(char *)string2.capacity);
            if (iVar1 == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8f4);
              if (string2.deallocator != (ACUtilsDeallocator)0x1) {
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x8f4,"Assertion \'_ck_x == _ck_y\' failed",
                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                  "(string2).size == strlen(\"a\")","(string2).size",
                                  string2.deallocator,"strlen(\"a\")",1,0);
              }
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8f4);
              if (string3.size != 8) {
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x8f5,"Assertion \'_ck_x == _ck_y\' failed",
                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                  "(string3).capacity == (8)","(string3).capacity",string3.size,
                                  "(8)",8,0);
              }
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8f5);
              if (string3.capacity == 0) {
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x8f5,"Assertion \'_ck_x != NULL\' failed",
                                  "Assertion \'%s\' failed: %s == %#x",
                                  "(void*) (string3).buffer != NULL","(void*) (string3).buffer",0,0)
                ;
              }
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8f5);
              _ck_y_s_3 = (char *)string3.capacity;
              if (string3.capacity == 0) {
                _ck_y_q_3 = "";
                _ck_y_s_3 = "(null)";
              }
              else {
                _ck_y_q_3 = "\"";
                iVar1 = strcmp("b",(char *)string3.capacity);
                if (iVar1 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8f5);
                  if (string3.deallocator != (ACUtilsDeallocator)0x1) {
                    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8f5,"Assertion \'_ck_x == _ck_y\' failed",
                                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                      "(string3).size == strlen(\"b\")","(string3).size",
                                      string3.deallocator,"strlen(\"b\")",1,0);
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8f5);
                  if (private_ACUtilsTest_AString_reallocCount != 0) {
                    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8f6,"Assertion \'_ck_x == _ck_y\' failed",
                                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                      "private_ACUtilsTest_AString_reallocCount == (0)",
                                      "private_ACUtilsTest_AString_reallocCount",
                                      private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8f6);
                  iVar1 = AString_compare((AString *)&_ck_x,(AString *)&string3.buffer);
                  if ((long)iVar1 < 1) {
                    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8f7,"Assertion \'_ck_x > _ck_y\' failed",
                                      "Assertion \'%s\' failed: %s == %jd, %s == %jd",
                                      "AString_compare(&string4, &string2) > 0",
                                      "AString_compare(&string4, &string2)",(long)iVar1,"0",0,0);
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8f7);
                  if (string2.size != 8) {
                    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8f8,"Assertion \'_ck_x == _ck_y\' failed",
                                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                      "(string2).capacity == (8)","(string2).capacity",string2.size,
                                      "(8)",8,0);
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8f8);
                  if (string2.capacity == 0) {
                    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8f8,"Assertion \'_ck_x != NULL\' failed",
                                      "Assertion \'%s\' failed: %s == %#x",
                                      "(void*) (string2).buffer != NULL","(void*) (string2).buffer",
                                      0,0);
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8f8);
                  _ck_y_s_4 = (char *)string2.capacity;
                  if (string2.capacity == 0) {
                    _ck_y_q_4 = "";
                    _ck_y_s_4 = "(null)";
                  }
                  else {
                    _ck_y_q_4 = "\"";
                    iVar1 = strcmp("a",(char *)string2.capacity);
                    if (iVar1 == 0) {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x8f8);
                      if (string2.deallocator != (ACUtilsDeallocator)0x1) {
                        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0x8f8,"Assertion \'_ck_x == _ck_y\' failed",
                                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                          "(string2).size == strlen(\"a\")","(string2).size",
                                          string2.deallocator,"strlen(\"a\")",1,0);
                      }
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x8f8);
                      if (string4.size != 8) {
                        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0x8f9,"Assertion \'_ck_x == _ck_y\' failed",
                                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                          "(string4).capacity == (8)","(string4).capacity",
                                          string4.size,"(8)",8,0);
                      }
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x8f9);
                      if (string4.capacity == 0) {
                        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0x8f9,"Assertion \'_ck_x != NULL\' failed",
                                          "Assertion \'%s\' failed: %s == %#x",
                                          "(void*) (string4).buffer != NULL",
                                          "(void*) (string4).buffer",0,0);
                      }
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x8f9);
                      _ck_y_s_5 = (char *)string4.capacity;
                      if (string4.capacity == 0) {
                        _ck_y_q_5 = "";
                        _ck_y_s_5 = "(null)";
                      }
                      else {
                        _ck_y_q_5 = "\"";
                        iVar1 = strcmp("ba",(char *)string4.capacity);
                        if (iVar1 == 0) {
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8f9);
                          if (string4.deallocator != (ACUtilsDeallocator)0x2) {
                            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x8f9,"Assertion \'_ck_x == _ck_y\' failed",
                                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                              "(string4).size == strlen(\"ba\")","(string4).size",
                                              string4.deallocator,"strlen(\"ba\")",2,0);
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8f9);
                          if (private_ACUtilsTest_AString_reallocCount != 0) {
                            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x8fa,"Assertion \'_ck_x == _ck_y\' failed",
                                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                              "private_ACUtilsTest_AString_reallocCount == (0)",
                                              "private_ACUtilsTest_AString_reallocCount",
                                              private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8fa);
                          iVar1 = AString_compare((AString *)&_ck_x,(AString *)&string4.buffer);
                          if ((long)iVar1 < 1) {
                            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x8fb,"Assertion \'_ck_x > _ck_y\' failed",
                                              "Assertion \'%s\' failed: %s == %jd, %s == %jd",
                                              "AString_compare(&string4, &string3) > 0",
                                              "AString_compare(&string4, &string3)",(long)iVar1,"0",
                                              0,0);
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8fb);
                          if (string3.size == 8) {
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0x8fc);
                            if (string3.capacity == 0) {
                              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                ,0x8fc,"Assertion \'_ck_x != NULL\' failed",
                                                "Assertion \'%s\' failed: %s == %#x",
                                                "(void*) (string3).buffer != NULL",
                                                "(void*) (string3).buffer",0,0);
                            }
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0x8fc);
                            _ck_y_s_6 = (char *)string3.capacity;
                            if (string3.capacity == 0) {
                              _ck_y_q_6 = "";
                              _ck_y_s_6 = "(null)";
                            }
                            else {
                              _ck_y_q_6 = "\"";
                              iVar1 = strcmp("b",(char *)string3.capacity);
                              if (iVar1 == 0) {
                                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                            ,0x8fc);
                                if (string3.deallocator != (ACUtilsDeallocator)0x1) {
                                  _ck_assert_failed(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fc,"Assertion \'_ck_x == _ck_y\' failed",
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                                  "(string3).size == strlen(\"b\")","(string3).size"
                                                  ,string3.deallocator,"strlen(\"b\")",1,0);
                                }
                                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                            ,0x8fc);
                                if (string4.size != 8) {
                                  _ck_assert_failed(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fd,"Assertion \'_ck_x == _ck_y\' failed",
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                                  "(string4).capacity == (8)","(string4).capacity",
                                                  string4.size,"(8)",8,0);
                                }
                                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                            ,0x8fd);
                                if (string4.capacity == 0) {
                                  _ck_assert_failed(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fd,"Assertion \'_ck_x != NULL\' failed",
                                                  "Assertion \'%s\' failed: %s == %#x",
                                                  "(void*) (string4).buffer != NULL",
                                                  "(void*) (string4).buffer",0,0);
                                }
                                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                            ,0x8fd);
                                _ck_y_s_7 = (char *)string4.capacity;
                                if (string4.capacity == 0) {
                                  _ck_y_q_7 = "";
                                  _ck_y_s_7 = "(null)";
                                }
                                else {
                                  _ck_y_q_7 = "\"";
                                  iVar1 = strcmp("ba",(char *)string4.capacity);
                                  if (iVar1 == 0) {
                                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                ,0x8fd);
                                    if (string4.deallocator != (ACUtilsDeallocator)0x2) {
                                      _ck_assert_failed(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fd,"Assertion \'_ck_x == _ck_y\' failed",
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                                  "(string4).size == strlen(\"ba\")",
                                                  "(string4).size",string4.deallocator,
                                                  "strlen(\"ba\")",2,0);
                                    }
                                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                ,0x8fd);
                                    if (private_ACUtilsTest_AString_reallocCount == 0) {
                                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fe);
                                      string.deallocator = (ACUtilsDeallocator)0x0;
                                      string.reallocator = string1.reallocator;
                                      string.size = 8;
                                      string.capacity = string1.capacity;
                                      string.buffer = in_stack_fffffffffffffbd0;
                                      private_ACUtilsTest_AString_destructTestString(string);
                                      string_00.deallocator = string2.deallocator;
                                      string_00.reallocator = string2.reallocator;
                                      string_00.size = string2.size;
                                      string_00.capacity = string2.capacity;
                                      string_00.buffer = in_stack_fffffffffffffbd0;
                                      private_ACUtilsTest_AString_destructTestString(string_00);
                                      string_01.deallocator = string3.deallocator;
                                      string_01.reallocator = string3.reallocator;
                                      string_01.size = string3.size;
                                      string_01.capacity = string3.capacity;
                                      string_01.buffer = in_stack_fffffffffffffbd0;
                                      private_ACUtilsTest_AString_destructTestString(string_01);
                                      string_02.deallocator = string4.deallocator;
                                      string_02.reallocator = string4.reallocator;
                                      string_02.size = string4.size;
                                      string_02.capacity = string4.capacity;
                                      string_02.buffer = in_stack_fffffffffffffbd0;
                                      private_ACUtilsTest_AString_destructTestString(string_02);
                                      return;
                                    }
                                    _ck_assert_failed(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fe,"Assertion \'_ck_x == _ck_y\' failed",
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                                  "private_ACUtilsTest_AString_reallocCount == (0)",
                                                  "private_ACUtilsTest_AString_reallocCount",
                                                  private_ACUtilsTest_AString_reallocCount,"(0)",0,0
                                                  );
                                  }
                                }
                                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8fd,
                                                  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                                  ,
                                                  "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s"
                                                  ,"(string4).buffer == (\"ba\")","(string4).buffer"
                                                  ,_ck_y_q_7,_ck_y_s_7,_ck_y_q_7,"(\"ba\")","\"",
                                                  "ba","\"",0);
                              }
                            }
                            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x8fc,
                                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                              ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s"
                                              ,"(string3).buffer == (\"b\")","(string3).buffer",
                                              _ck_y_q_6,_ck_y_s_6,_ck_y_q_6,"(\"b\")","\"","b","\"",
                                              0);
                          }
                          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                            ,0x8fc,"Assertion \'_ck_x == _ck_y\' failed",
                                            "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                            "(string3).capacity == (8)","(string3).capacity",
                                            string3.size,"(8)",8,0);
                        }
                      }
                      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0x8f9,
                                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                        "(string4).buffer == (\"ba\")","(string4).buffer",_ck_y_q_5,
                                        _ck_y_s_5,_ck_y_q_5,"(\"ba\")","\"","ba","\"",0);
                    }
                  }
                  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                    ,0x8f8,
                                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                    "(string2).buffer == (\"a\")","(string2).buffer",_ck_y_q_4,
                                    _ck_y_s_4,_ck_y_q_4,"(\"a\")","\"","a","\"",0);
                }
              }
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x8f5,
                                "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                "(string3).buffer == (\"b\")","(string3).buffer",_ck_y_q_3,_ck_y_s_3
                                ,_ck_y_q_3,"(\"b\")","\"","b","\"",0);
            }
          }
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x8f4,
                            "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                            ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                            "(string2).buffer == (\"a\")","(string2).buffer",_ck_y_q_2,_ck_y_s_2,
                            _ck_y_q_2,"(\"a\")","\"","a","\"",0);
        }
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x8f1,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(string2).buffer == (\"a\")","(string2).buffer",_ck_y_q_1,_ck_y_s_1,
                        _ck_y_q_1,"(\"a\")","\"","a","\"",0);
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x8f0,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(string1).buffer == (\"\")","(string1).buffer",_ck_y_q,_ck_y_s,_ck_y_q,"(\"\")"
                    ,"\"","","\"",0);
}

Assistant:

END_TEST
START_TEST(test_AString_compare_firstGreaterThanSecond)
{
    struct AString string1 = private_ACUtilsTest_AString_constructTestString("", 8);
    struct AString string2 = private_ACUtilsTest_AString_constructTestString("a", 8);
    struct AString string3 = private_ACUtilsTest_AString_constructTestString("b", 8);
    struct AString string4 = private_ACUtilsTest_AString_constructTestString("ba", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT_INT_GT(AString_compare(&string2, &string1), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string1, "", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string2, "a", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_GT(AString_compare(&string3, &string2), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string2, "a", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string3, "b", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_GT(AString_compare(&string4, &string2), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string2, "a", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string4, "ba", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT_INT_GT(AString_compare(&string4, &string3), 0);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string3, "b", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string4, "ba", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string1);
    private_ACUtilsTest_AString_destructTestString(string2);
    private_ACUtilsTest_AString_destructTestString(string3);
    private_ACUtilsTest_AString_destructTestString(string4);
}